

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ss_swapmerge(uchar *T,int *PA,int *first,int *middle,int *last,int *buf,int bufsize,int depth)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  uchar *puVar7;
  uint *puVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  uchar *puVar12;
  byte *pbVar13;
  byte bVar14;
  int iVar15;
  byte *pbVar16;
  byte bVar17;
  ulong uVar18;
  uint *puVar19;
  uint *puVar20;
  uint *puVar21;
  ulong uVar22;
  byte *pbVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint *puVar28;
  bool bVar29;
  bool bVar30;
  anon_struct_32_4_d8a569f3 stack [32];
  uint local_47c;
  int *local_470;
  ulong auStack_438 [3];
  uint auStack_420 [252];
  
  uVar5 = 0;
  local_47c = 0;
LAB_001c6618:
  uVar18 = (long)last - (long)middle;
  uVar27 = (long)uVar18 >> 2;
  iVar15 = (int)uVar5;
  if ((long)uVar27 <= (long)bufsize) {
    if ((middle < last) && (first < middle)) {
      iVar4 = (int)(uVar18 >> 2);
      if (0 < iVar4) {
        uVar24 = iVar4 + 1;
        lVar25 = 0;
        do {
          uVar1 = *(undefined4 *)((long)buf + lVar25);
          *(undefined4 *)((long)buf + lVar25) = *(undefined4 *)((long)middle + lVar25);
          *(undefined4 *)((long)middle + lVar25) = uVar1;
          lVar25 = lVar25 + 4;
          uVar24 = uVar24 - 1;
        } while (1 < uVar24);
      }
      puVar19 = (uint *)((long)buf + (uVar18 - 4));
      uVar24 = (int)*puVar19 >> 0x1f;
      local_470 = PA + (uVar24 ^ *puVar19);
      puVar6 = (uint *)middle + -1;
      uVar10 = (int)((uint *)middle)[-1] >> 0x1f;
      uVar24 = uVar10 * -2 - uVar24;
      piVar9 = PA + (uVar10 ^ ((uint *)middle)[-1]);
      puVar8 = (uint *)last + -1;
      uVar10 = ((uint *)last)[-1];
LAB_001c69d2:
      while( true ) {
        lVar25 = (long)*local_470;
        lVar26 = (long)*piVar9;
        pbVar23 = T + lVar25 + 2;
        pbVar13 = T + lVar26 + 2;
        pbVar16 = T + (long)piVar9[1] + 2;
        bVar29 = pbVar13 < pbVar16;
        bVar30 = pbVar23 < T + (long)local_470[1] + 2;
        puVar21 = (uint *)buf;
        if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
          do {
            bVar17 = puVar7[lVar25 + 2];
            bVar14 = puVar7[lVar26 + 2];
            if (bVar17 != bVar14) goto LAB_001c6a61;
            pbVar23 = puVar7 + lVar26 + 3;
            bVar29 = pbVar23 < pbVar16;
            puVar12 = puVar7 + 1;
            bVar30 = puVar7 + lVar25 + 3 < T + (long)local_470[1] + 2;
          } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
          pbVar23 = puVar12 + lVar25 + 2;
          pbVar13 = puVar12 + lVar26 + 2;
        }
        if (!bVar30) break;
        if (bVar29 != false) {
          bVar17 = *pbVar23;
          bVar14 = *pbVar13;
LAB_001c6a61:
          iVar4 = (uint)bVar17 - (uint)bVar14;
          if (iVar4 == 0 || (uint)bVar17 < (uint)bVar14) goto LAB_001c6a8d;
        }
        uVar3 = *puVar19;
        puVar20 = puVar19;
        if ((uVar24 & 1) != 0) {
          do {
            *puVar8 = uVar3;
            puVar20 = puVar8 + -1;
            puVar8 = puVar8 + -1;
            *puVar19 = *puVar20;
            uVar3 = puVar19[-1];
            puVar19 = puVar19 + -1;
          } while ((int)uVar3 < 0);
          uVar24 = uVar24 & 0xfffffffe;
          puVar20 = puVar19;
        }
        *puVar8 = uVar3;
        if (puVar20 <= buf) goto LAB_001c73cc;
        puVar8 = puVar8 + -1;
        puVar19 = puVar20 + -1;
        *puVar20 = *puVar8;
        uVar3 = puVar20[-1];
        if ((long)(int)uVar3 < 0) {
          local_470 = PA + ~uVar3;
          uVar24 = uVar24 | 1;
        }
        else {
          local_470 = PA + (int)uVar3;
        }
      }
      iVar4 = -(uint)bVar29;
LAB_001c6a8d:
      if (iVar4 < 0) {
        uVar3 = *puVar6;
        if ((uVar24 & 2) != 0) {
          do {
            *puVar8 = uVar3;
            puVar21 = puVar8 + -1;
            puVar8 = puVar8 + -1;
            *puVar6 = *puVar21;
            uVar3 = puVar6[-1];
            puVar6 = puVar6 + -1;
          } while ((int)uVar3 < 0);
          uVar24 = uVar24 & 0xfffffffd;
        }
        *puVar8 = uVar3;
        puVar21 = puVar8 + -1;
        puVar8 = puVar8 + -1;
        *puVar6 = *puVar21;
        puVar6 = puVar6 + -1;
        if (puVar6 < first) goto joined_r0x001c7069;
        uVar3 = *puVar6;
        uVar2 = ~uVar3;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        if (-1 >= (int)uVar3) {
          uVar24 = uVar24 | 2;
        }
        piVar9 = PA + uVar2;
        goto LAB_001c69d2;
      }
      uVar3 = *puVar19;
      if ((uVar24 & 1) != 0) {
        do {
          *puVar8 = uVar3;
          puVar20 = puVar8 + -1;
          puVar8 = puVar8 + -1;
          *puVar19 = *puVar20;
          uVar3 = puVar19[-1];
          puVar19 = puVar19 + -1;
        } while ((int)uVar3 < 0);
        uVar24 = uVar24 & 0xfffffffe;
      }
      *puVar8 = ~uVar3;
      if (puVar19 <= buf) goto LAB_001c73cc;
      puVar21 = puVar8 + -1;
      *puVar19 = puVar8[-1];
      uVar3 = *puVar6;
      if ((uVar24 & 2) != 0) {
        do {
          *puVar21 = uVar3;
          puVar8 = puVar21 + -1;
          puVar21 = puVar21 + -1;
          *puVar6 = *puVar8;
          uVar3 = puVar6[-1];
          puVar6 = puVar6 + -1;
        } while ((int)uVar3 < 0);
        uVar24 = 0;
      }
      puVar19 = puVar19 + -1;
      *puVar21 = uVar3;
      puVar8 = puVar21 + -1;
      *puVar6 = puVar21[-1];
      puVar6 = puVar6 + -1;
      if (first <= puVar6) {
        uVar3 = *puVar19;
        uVar24 = uVar3 >> 0x1f | uVar24;
        local_470 = PA + ((int)uVar3 >> 0x1f ^ uVar3);
        uVar3 = *puVar6;
        if ((long)(int)uVar3 < 0) {
          piVar9 = PA + ~uVar3;
          uVar24 = uVar24 | 2;
        }
        else {
          piVar9 = PA + (int)uVar3;
        }
        goto LAB_001c69d2;
      }
      for (; buf < puVar19; puVar19 = puVar19 + -1) {
        *puVar8 = *puVar19;
        *puVar19 = puVar8[-1];
        puVar8 = puVar8 + -1;
      }
      goto LAB_001c73c7;
    }
    goto LAB_001c73cf;
  }
  local_470 = (int *)((long)middle - (long)first);
  uVar5 = (long)local_470 >> 2;
  if ((long)uVar5 <= (long)bufsize) {
    if (first < middle) {
      iVar4 = (int)((ulong)local_470 >> 2);
      if (0 < iVar4) {
        uVar24 = iVar4 + 1;
        lVar25 = 0;
        do {
          uVar1 = *(undefined4 *)((long)buf + lVar25);
          *(undefined4 *)((long)buf + lVar25) = *(undefined4 *)((long)first + lVar25);
          *(undefined4 *)((long)first + lVar25) = uVar1;
          lVar25 = lVar25 + 4;
          uVar24 = uVar24 - 1;
        } while (1 < uVar24);
      }
      puVar6 = (uint *)((long)buf + ((long)local_470 - 4U));
      uVar24 = *first;
      puVar19 = (uint *)first;
      puVar8 = (uint *)buf;
      do {
        while( true ) {
          uVar27 = (ulong)(int)*puVar8;
          uVar5 = (ulong)*middle;
          lVar25 = (long)PA[uVar27];
          lVar26 = (long)PA[uVar5];
          pbVar23 = T + lVar25 + 2;
          pbVar13 = T + lVar26 + 2;
          pbVar16 = T + (long)PA[uVar5 + 1] + 2;
          bVar29 = pbVar13 < pbVar16;
          bVar30 = pbVar23 < T + (long)PA[uVar27 + 1] + 2;
          puVar21 = puVar19;
          puVar20 = (uint *)middle;
          if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
            do {
              bVar17 = puVar7[lVar25 + 2];
              bVar14 = puVar7[lVar26 + 2];
              if (bVar17 != bVar14) goto LAB_001c6d4a;
              pbVar23 = puVar7 + lVar26 + 3;
              bVar29 = pbVar23 < pbVar16;
              puVar12 = puVar7 + 1;
              bVar30 = puVar7 + lVar25 + 3 < T + (long)PA[uVar27 + 1] + 2;
            } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
            pbVar23 = puVar12 + lVar25 + 2;
            pbVar13 = puVar12 + lVar26 + 2;
          }
          if (!bVar30) break;
          if (bVar29 != false) {
            bVar17 = *pbVar23;
            bVar14 = *pbVar13;
LAB_001c6d4a:
            iVar4 = (uint)bVar17 - (uint)bVar14;
            goto LAB_001c6d5a;
          }
LAB_001c6d76:
          do {
            middle = (int *)(puVar20 + 1);
            puVar19 = puVar21 + 1;
            *puVar21 = (uint)uVar5;
            *puVar20 = *puVar19;
            if (last <= middle) goto joined_r0x001c70dd;
            uVar5 = (ulong)(uint)*middle;
            puVar21 = puVar19;
            puVar20 = (uint *)middle;
          } while (*middle < 0);
        }
        iVar4 = -(uint)bVar29;
LAB_001c6d5a:
        puVar28 = puVar8;
        if (iVar4 < 0) {
          do {
            *puVar19 = (uint)uVar27;
            if (puVar6 <= puVar28) goto LAB_001c715d;
            puVar21 = puVar19 + 1;
            puVar19 = puVar19 + 1;
            puVar8 = puVar28 + 1;
            *puVar28 = *puVar21;
            puVar21 = puVar28 + 1;
            uVar27 = (ulong)*puVar21;
            puVar28 = puVar8;
          } while ((int)*puVar21 < 0);
        }
        else {
          if (iVar4 != 0) goto LAB_001c6d76;
          *middle = ~*middle;
          uVar10 = *puVar8;
          puVar21 = puVar19 + 2;
          puVar20 = puVar8;
          do {
            puVar28 = puVar21;
            *puVar19 = uVar10;
            if (puVar6 <= puVar20) goto LAB_001c715d;
            puVar21 = puVar19 + 1;
            puVar19 = puVar19 + 1;
            puVar8 = puVar20 + 1;
            *puVar20 = *puVar21;
            uVar10 = puVar20[1];
            puVar21 = puVar28 + 1;
            puVar20 = puVar8;
          } while ((int)uVar10 < 0);
          uVar10 = *middle;
          puVar21 = (uint *)middle;
          do {
            puVar19 = puVar28;
            middle = (int *)(puVar21 + 1);
            puVar19[-1] = uVar10;
            *puVar21 = *puVar19;
            if (last <= middle) goto joined_r0x001c7346;
            uVar10 = *middle;
            puVar28 = puVar19 + 1;
            puVar21 = (uint *)middle;
          } while ((int)uVar10 < 0);
        }
      } while( true );
    }
    goto LAB_001c7160;
  }
  if ((long)uVar5 < (long)uVar27) {
    uVar27 = uVar5;
  }
  if (0 < (int)uVar27) {
    uVar5 = 0;
    do {
      uVar24 = (uint)uVar27;
      uVar27 = uVar27 >> 1 & 0x7fffffff;
      iVar4 = (int)uVar5;
      uVar22 = (ulong)((int)((uint *)middle)[(long)iVar4 + uVar27] >> 0x1f ^
                      ((uint *)middle)[(long)iVar4 + uVar27]);
      uVar11 = (ulong)((int)((uint *)middle)[(-1 - uVar27) - (long)iVar4] >> 0x1f ^
                      ((uint *)middle)[(-1 - uVar27) - (long)iVar4]);
      lVar25 = (long)PA[uVar22];
      lVar26 = (long)PA[uVar11];
      pbVar23 = T + lVar25 + 2;
      pbVar13 = T + lVar26 + 2;
      pbVar16 = T + (long)PA[uVar11 + 1] + 2;
      bVar29 = pbVar13 < pbVar16;
      bVar30 = pbVar23 < T + (long)PA[uVar22 + 1] + 2;
      if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
        do {
          bVar17 = puVar7[lVar25 + 2];
          if (bVar17 != puVar7[lVar26 + 2]) {
            pbVar13 = puVar7 + lVar26 + 2;
            goto LAB_001c6734;
          }
          pbVar23 = puVar7 + lVar26 + 3;
          bVar29 = pbVar23 < pbVar16;
          puVar12 = puVar7 + 1;
          bVar30 = puVar7 + lVar25 + 3 < T + (long)PA[uVar22 + 1] + 2;
        } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
        pbVar23 = puVar12 + lVar25 + 2;
        pbVar13 = puVar12 + lVar26 + 2;
      }
      if (bVar30) {
        if (bVar29) {
          bVar17 = *pbVar23;
LAB_001c6734:
          if (bVar17 < *pbVar13) goto LAB_001c6739;
        }
      }
      else if (bVar29) {
LAB_001c6739:
        uVar5 = (ulong)(iVar4 + (int)uVar27 + 1);
        uVar27 = (ulong)((int)uVar27 - (~uVar24 & 1));
      }
    } while (0 < (int)uVar27);
    if (0 < (int)uVar5) {
      puVar19 = (uint *)middle + -uVar5;
      uVar24 = (int)uVar5 + 1;
      puVar8 = (uint *)middle;
      do {
        uVar10 = puVar8[-uVar5];
        puVar8[-uVar5] = *puVar8;
        *puVar8 = uVar10;
        puVar8 = puVar8 + 1;
        uVar24 = uVar24 - 1;
      } while (1 < uVar24);
      puVar21 = (uint *)middle + uVar5;
      uVar24 = 0;
      puVar8 = (uint *)middle;
      puVar6 = (uint *)middle;
      if (puVar21 < last) {
        if ((int)*puVar21 < 0) {
          *puVar21 = ~*puVar21;
          uVar24 = 1;
          if (first < puVar19) {
            do {
              local_470 = (int *)((long)local_470 - 4);
              puVar20 = puVar6 + -1;
              puVar6 = puVar6 + -1;
            } while ((int)*puVar20 < 0);
            uVar24 = 5;
          }
        }
        else if (first < puVar19) {
          puVar8 = (uint *)middle + -1;
          uVar18 = (long)last + (4 - (long)middle);
          do {
            uVar18 = uVar18 - 4;
            puVar20 = puVar8 + 1;
            puVar8 = puVar8 + 1;
          } while ((int)*puVar20 < 0);
          uVar24 = 2;
        }
      }
      if ((long)uVar18 < (long)local_470) {
        if (0x1f < iVar15) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb7ea,
                        "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                       );
        }
        uVar10 = uVar24 ^ 6;
        if ((uVar24 & 2) == 0) {
          uVar10 = uVar24;
        }
        if (puVar8 != (uint *)middle) {
          uVar10 = uVar24;
        }
        lVar25 = (long)iVar15;
        auStack_438[lVar25 * 4] = (ulong)first;
        auStack_438[lVar25 * 4 + 1] = (ulong)puVar19;
        *(uint **)(auStack_420 + lVar25 * 8 + -2) = puVar6;
        uVar5 = (ulong)(iVar15 + 1);
        auStack_420[lVar25 * 8] = uVar10 & 0xfffffffc | local_47c & 3;
        local_47c = local_47c & 4 | uVar10 & 3;
        first = (int *)puVar8;
        middle = (int *)puVar21;
      }
      else {
        if (0x1f < iVar15) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb7e6,
                        "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                       );
        }
        lVar25 = (long)iVar15;
        auStack_438[lVar25 * 4] = (ulong)puVar8;
        auStack_438[lVar25 * 4 + 1] = (ulong)puVar21;
        *(int **)(auStack_420 + lVar25 * 8 + -2) = last;
        uVar5 = (ulong)(iVar15 + 1);
        auStack_420[lVar25 * 8] = local_47c & 4 | uVar24 & 3;
        local_47c = local_47c & 3 | uVar24 & 0xfffffffc;
        middle = (int *)puVar19;
        last = (int *)puVar6;
      }
      goto LAB_001c6618;
    }
  }
  uVar5 = (ulong)((int)((uint *)middle)[-1] >> 0x1f ^ ((uint *)middle)[-1]);
  uVar24 = *middle;
  lVar26 = (long)PA[uVar5];
  lVar25 = (long)PA[(int)uVar24];
  pbVar23 = T + lVar26 + 2;
  pbVar13 = T + lVar25 + 2;
  pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
  bVar29 = pbVar13 < pbVar16;
  bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
  if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
    do {
      bVar17 = puVar7[lVar26 + 2];
      if (bVar17 != puVar7[lVar25 + 2]) {
        pbVar13 = puVar7 + lVar25 + 2;
        goto LAB_001c6ed3;
      }
      pbVar23 = puVar7 + lVar25 + 3;
      bVar29 = pbVar23 < pbVar16;
      puVar12 = puVar7 + 1;
      bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
    } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
    pbVar23 = puVar12 + lVar26 + 2;
    pbVar13 = puVar12 + lVar25 + 2;
  }
  if (bVar30) {
    if (bVar29 != false) {
      bVar17 = *pbVar23;
LAB_001c6ed3:
      iVar4 = (uint)bVar17 - (uint)*pbVar13;
      goto LAB_001c6edc;
    }
  }
  else {
    iVar4 = -(uint)bVar29;
LAB_001c6edc:
    if (iVar4 == 0) {
      *middle = ~uVar24;
    }
  }
  if ((local_47c & 1) == 0) {
    if ((local_47c & 2) != 0) {
      uVar5 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      uVar24 = *first;
      lVar26 = (long)PA[uVar5];
      lVar25 = (long)PA[(int)uVar24];
      pbVar23 = T + lVar26 + 2;
      pbVar13 = T + lVar25 + 2;
      pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
      bVar29 = pbVar13 < pbVar16;
      bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
      if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
        do {
          bVar17 = puVar7[lVar26 + 2];
          if (bVar17 != puVar7[lVar25 + 2]) {
            pbVar13 = puVar7 + lVar25 + 2;
            goto LAB_001c712b;
          }
          pbVar23 = puVar7 + lVar25 + 3;
          bVar29 = pbVar23 < pbVar16;
          puVar12 = puVar7 + 1;
          bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
        } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
        pbVar23 = puVar12 + lVar26 + 2;
        pbVar13 = puVar12 + lVar25 + 2;
      }
      if (bVar30) {
        if (bVar29 == false) goto LAB_001c6fb5;
        bVar17 = *pbVar23;
LAB_001c712b:
        iVar4 = (uint)bVar17 - (uint)*pbVar13;
      }
      else {
        iVar4 = -(uint)bVar29;
      }
      if (iVar4 == 0) goto LAB_001c6fb0;
    }
  }
  else {
    uVar24 = *first;
LAB_001c6fb0:
    *first = ~uVar24;
  }
LAB_001c6fb5:
  if ((local_47c & 4) != 0) {
    uVar5 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar24 = *last;
    lVar26 = (long)PA[uVar5];
    lVar25 = (long)PA[(int)uVar24];
    pbVar23 = T + lVar26 + 2;
    pbVar13 = T + lVar25 + 2;
    pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
    bVar29 = pbVar13 < pbVar16;
    bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
    if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
      do {
        bVar17 = puVar7[lVar26 + 2];
        if (bVar17 != puVar7[lVar25 + 2]) {
          pbVar13 = puVar7 + lVar25 + 2;
          goto LAB_001c70b1;
        }
        pbVar23 = puVar7 + lVar25 + 3;
        bVar29 = pbVar23 < pbVar16;
        puVar12 = puVar7 + 1;
        bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
      } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
      pbVar23 = puVar12 + lVar26 + 2;
      pbVar13 = puVar12 + lVar25 + 2;
    }
    if (bVar30) {
      if (bVar29 == false) goto LAB_001c70c3;
      bVar17 = *pbVar23;
LAB_001c70b1:
      iVar4 = (uint)bVar17 - (uint)*pbVar13;
    }
    else {
      iVar4 = -(uint)bVar29;
    }
    if (iVar4 == 0) {
      *last = ~uVar24;
    }
  }
LAB_001c70c3:
  if (iVar15 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7f2,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
  goto LAB_001c757c;
joined_r0x001c7069:
  for (; buf < puVar19; puVar19 = puVar19 + -1) {
    *puVar8 = *puVar19;
    *puVar19 = puVar8[-1];
    puVar8 = puVar8 + -1;
  }
LAB_001c73c7:
  *puVar8 = *puVar19;
  puVar21 = puVar19;
LAB_001c73cc:
  *puVar21 = uVar10;
LAB_001c73cf:
  if ((local_47c & 1) == 0) {
    if ((local_47c & 2) != 0) {
      uVar5 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      uVar24 = *first;
      lVar26 = (long)PA[uVar5];
      lVar25 = (long)PA[(int)uVar24];
      pbVar23 = T + lVar26 + 2;
      pbVar13 = T + lVar25 + 2;
      pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
      bVar29 = pbVar13 < pbVar16;
      bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
      if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
        do {
          bVar17 = puVar7[lVar26 + 2];
          if (bVar17 != puVar7[lVar25 + 2]) {
            pbVar13 = puVar7 + lVar25 + 2;
            goto LAB_001c75c4;
          }
          pbVar23 = puVar7 + lVar25 + 3;
          bVar29 = pbVar23 < pbVar16;
          puVar12 = puVar7 + 1;
          bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
        } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
        pbVar23 = puVar12 + lVar26 + 2;
        pbVar13 = puVar12 + lVar25 + 2;
      }
      if (bVar30) {
        if (bVar29 == false) goto LAB_001c74a3;
        bVar17 = *pbVar23;
LAB_001c75c4:
        iVar4 = (uint)bVar17 - (uint)*pbVar13;
      }
      else {
        iVar4 = -(uint)bVar29;
      }
      if (iVar4 == 0) goto LAB_001c749f;
    }
  }
  else {
    uVar24 = *first;
LAB_001c749f:
    *first = ~uVar24;
  }
LAB_001c74a3:
  if ((local_47c & 4) != 0) {
    uVar5 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar24 = *last;
    lVar26 = (long)PA[uVar5];
    lVar25 = (long)PA[(int)uVar24];
    pbVar23 = T + lVar26 + 2;
    pbVar13 = T + lVar25 + 2;
    pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
    bVar29 = pbVar13 < pbVar16;
    bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
    if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
      do {
        bVar17 = puVar7[lVar26 + 2];
        if (bVar17 != puVar7[lVar25 + 2]) {
          pbVar13 = puVar7 + lVar25 + 2;
          goto LAB_001c7562;
        }
        pbVar23 = puVar7 + lVar25 + 3;
        bVar29 = pbVar23 < pbVar16;
        puVar12 = puVar7 + 1;
        bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
      } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
      pbVar23 = puVar12 + lVar26 + 2;
      pbVar13 = puVar12 + lVar25 + 2;
    }
    if (bVar30) {
      if (bVar29 == false) goto LAB_001c7574;
      bVar17 = *pbVar23;
LAB_001c7562:
      iVar4 = (uint)bVar17 - (uint)*pbVar13;
    }
    else {
      iVar4 = -(uint)bVar29;
    }
    if (iVar4 == 0) {
      *last = ~uVar24;
    }
  }
LAB_001c7574:
  if (iVar15 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7bf,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
  goto LAB_001c757c;
joined_r0x001c7346:
  for (; puVar8 < puVar6; puVar8 = puVar8 + 1) {
    *puVar19 = *puVar8;
    *puVar8 = puVar19[1];
    puVar19 = puVar19 + 1;
  }
  goto LAB_001c7149;
joined_r0x001c70dd:
  for (; puVar8 < puVar6; puVar8 = puVar8 + 1) {
    *puVar19 = *puVar8;
    *puVar8 = puVar19[1];
    puVar19 = puVar19 + 1;
  }
LAB_001c7149:
  puVar6 = puVar8;
  *puVar19 = *puVar6;
LAB_001c715d:
  *puVar6 = uVar24;
LAB_001c7160:
  if ((local_47c & 1) == 0) {
    if ((local_47c & 2) != 0) {
      uVar5 = (ulong)((int)((uint *)first)[-1] >> 0x1f ^ ((uint *)first)[-1]);
      uVar24 = *first;
      lVar26 = (long)PA[uVar5];
      lVar25 = (long)PA[(int)uVar24];
      pbVar23 = T + lVar26 + 2;
      pbVar13 = T + lVar25 + 2;
      pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
      bVar29 = pbVar13 < pbVar16;
      bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
      if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
        do {
          bVar17 = puVar7[lVar26 + 2];
          if (bVar17 != puVar7[lVar25 + 2]) {
            pbVar13 = puVar7 + lVar25 + 2;
            goto LAB_001c732b;
          }
          pbVar23 = puVar7 + lVar25 + 3;
          bVar29 = pbVar23 < pbVar16;
          puVar12 = puVar7 + 1;
          bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
        } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
        pbVar23 = puVar12 + lVar26 + 2;
        pbVar13 = puVar12 + lVar25 + 2;
      }
      if (bVar30) {
        if (bVar29 == false) goto LAB_001c722c;
        bVar17 = *pbVar23;
LAB_001c732b:
        iVar4 = (uint)bVar17 - (uint)*pbVar13;
      }
      else {
        iVar4 = -(uint)bVar29;
      }
      if (iVar4 == 0) goto LAB_001c7228;
    }
  }
  else {
    uVar24 = *first;
LAB_001c7228:
    *first = ~uVar24;
  }
LAB_001c722c:
  if ((local_47c & 4) != 0) {
    uVar5 = (ulong)((int)((uint *)last)[-1] >> 0x1f ^ ((uint *)last)[-1]);
    uVar24 = *last;
    lVar26 = (long)PA[uVar5];
    lVar25 = (long)PA[(int)uVar24];
    pbVar23 = T + lVar26 + 2;
    pbVar13 = T + lVar25 + 2;
    pbVar16 = T + (long)PA[(long)(int)uVar24 + 1] + 2;
    bVar29 = pbVar13 < pbVar16;
    bVar30 = pbVar23 < T + (long)PA[uVar5 + 1] + 2;
    if ((bVar30) && (puVar7 = T, pbVar13 < pbVar16)) {
      do {
        bVar17 = puVar7[lVar26 + 2];
        if (bVar17 != puVar7[lVar25 + 2]) {
          pbVar13 = puVar7 + lVar25 + 2;
          goto LAB_001c72eb;
        }
        pbVar23 = puVar7 + lVar25 + 3;
        bVar29 = pbVar23 < pbVar16;
        puVar12 = puVar7 + 1;
        bVar30 = puVar7 + lVar26 + 3 < T + (long)PA[uVar5 + 1] + 2;
      } while ((bVar30) && (puVar7 = puVar12, pbVar23 < pbVar16));
      pbVar23 = puVar12 + lVar26 + 2;
      pbVar13 = puVar12 + lVar25 + 2;
    }
    if (bVar30) {
      if (bVar29 == false) goto LAB_001c72fd;
      bVar17 = *pbVar23;
LAB_001c72eb:
      iVar4 = (uint)bVar17 - (uint)*pbVar13;
    }
    else {
      iVar4 = -(uint)bVar29;
    }
    if (iVar4 == 0) {
      *last = ~uVar24;
    }
  }
LAB_001c72fd:
  if (iVar15 < 0) {
    __assert_fail("0 <= ssize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb7c8,
                  "void ss_swapmerge(const unsigned char *, const int *, int *, int *, int *, int *, int, int)"
                 );
  }
LAB_001c757c:
  if (iVar15 == 0) {
    return;
  }
  uVar5 = (ulong)(iVar15 - 1);
  first = (int *)auStack_438[uVar5 * 4];
  middle = (int *)auStack_438[uVar5 * 4 + 1];
  last = *(int **)(auStack_420 + uVar5 * 8 + -2);
  local_47c = auStack_420[uVar5 * 8];
  goto LAB_001c6618;
}

Assistant:

static
void
ss_swapmerge(const unsigned char *T, const int *PA,
             int *first, int *middle, int *last,
             int *buf, int bufsize, int depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { int *a, *b, *c; int d; } stack[STACK_SIZE];
  int *l, *r, *lm, *rm;
  int m, len, half;
  int ssize;
  int check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}